

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>
::InnerMap::TransferList(InnerMap *this,void **table,size_type index)

{
  Node *pNVar1;
  size_type b;
  Node *node;
  iterator iStack_38;
  
  node = (Node *)table[index];
  do {
    pNVar1 = node->next;
    b = BucketNumber(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)node)
    ;
    InsertUnique(&iStack_38,this,b,node);
    node = pNVar1;
  } while (pNVar1 != (Node *)0x0);
  return;
}

Assistant:

void TransferList(void* const* table, size_type index) {
      Node* node = static_cast<Node*>(table[index]);
      do {
        Node* next = node->next;
        InsertUnique(BucketNumber(*KeyPtrFromNodePtr(node)), node);
        node = next;
      } while (node != NULL);
    }